

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void Qiniu_Region_Set_Bucket_Alternative_Hosts
               (Qiniu_Region *region,char **hosts,size_t hostsCount,Qiniu_Bool useHttps)

{
  _Qiniu_Region_Service *p_Var1;
  _Qiniu_Region_Service *p_Var2;
  
  if (region != (Qiniu_Region *)0x0) {
    p_Var2 = region->ucService;
    if (p_Var2 != (_Qiniu_Region_Service *)0x0) {
      p_Var1 = _Qiniu_Region_Service_New
                         (p_Var2->hosts,p_Var2->acceleratedHostsCount,
                          p_Var2->hosts + p_Var2->acceleratedHostsCount,p_Var2->preferredHostsCount,
                          hosts,hostsCount,useHttps);
      region->ucService = p_Var1;
      _Qiniu_Region_Service_Free(p_Var2);
      return;
    }
    p_Var2 = _Qiniu_Region_Service_New((char **)0x0,0,(char **)0x0,0,hosts,hostsCount,useHttps);
    region->ucService = p_Var2;
  }
  return;
}

Assistant:

void Qiniu_Region_Set_Bucket_Alternative_Hosts(Qiniu_Region *region, const char *const *hosts, size_t hostsCount, Qiniu_Bool useHttps)
{
    if (region == NULL)
    {
        return;
    }
    if (region->ucService != NULL)
    {
        struct _Qiniu_Region_Service *oldUcService = region->ucService;
        region->ucService = _Qiniu_Region_Service_New(
            oldUcService->hosts, oldUcService->acceleratedHostsCount,
            oldUcService->hosts + oldUcService->acceleratedHostsCount, oldUcService->preferredHostsCount,
            hosts, hostsCount,
            useHttps);
        _Qiniu_Region_Service_Free(oldUcService);
    }
    else
    {
        region->ucService = _Qiniu_Region_Service_New(NULL, 0, NULL, 0, hosts, hostsCount, useHttps);
    }
}